

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

size_t __thiscall
kj::Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
::eraseAllImpl<kj::_::IterRange<kj::_::BTreeImpl::Iterator>&>
          (Table<kj::TreeMap<kj::String,int>::Entry,kj::TreeIndex<kj::TreeMap<kj::String,int>::Callbacks>>
           *this,IterRange<kj::_::BTreeImpl::Iterator> *collection)

{
  ArrayDisposer *this_00;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  size_t pos_1;
  unsigned_long *__end2;
  unsigned_long *__begin2;
  Vector<unsigned_long> *__range2_1;
  size_t erasureNumber;
  size_t pos;
  Iterator __end0;
  Iterator __begin0;
  IterRange<kj::_::BTreeImpl::Iterator> *__range2;
  undefined1 local_38 [8];
  Vector<unsigned_long> erased;
  IterRange<kj::_::BTreeImpl::Iterator> *collection_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  erased.builder.disposer = (ArrayDisposer *)collection;
  Vector<unsigned_long>::Vector((Vector<unsigned_long> *)local_38);
  kj::_::tryReserveSize<kj::Vector<unsigned_long>&,kj::_::IterRange<kj::_::BTreeImpl::Iterator>&>
            ((Vector<unsigned_long> *)local_38,
             (IterRange<kj::_::BTreeImpl::Iterator> *)erased.builder.disposer);
  this_00 = erased.builder.disposer;
  kj::_::IterRange<kj::_::BTreeImpl::Iterator>::begin
            ((Iterator *)&__end0.row,
             (IterRange<kj::_::BTreeImpl::Iterator> *)erased.builder.disposer);
  kj::_::IterRange<kj::_::BTreeImpl::Iterator>::end
            ((Iterator *)&pos,(IterRange<kj::_::BTreeImpl::Iterator> *)this_00);
  while( true ) {
    bVar1 = kj::_::BTreeImpl::Iterator::operator==((Iterator *)&__end0.row,(Iterator *)&pos);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    erasureNumber = kj::_::BTreeImpl::Iterator::operator*((Iterator *)&__end0.row);
    while( true ) {
      sVar5 = erasureNumber;
      sVar2 = Vector<kj::TreeMap<kj::String,_int>::Entry>::size
                        ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
      sVar3 = Vector<unsigned_long>::size((Vector<unsigned_long> *)local_38);
      if (sVar5 < sVar2 - sVar3) break;
      sVar5 = Vector<kj::TreeMap<kj::String,_int>::Entry>::size
                        ((Vector<kj::TreeMap<kj::String,_int>::Entry> *)this);
      puVar4 = Vector<unsigned_long>::operator[]
                         ((Vector<unsigned_long> *)local_38,~erasureNumber + sVar5);
      erasureNumber = *puVar4;
    }
    Vector<unsigned_long>::add<unsigned_long&>((Vector<unsigned_long> *)local_38,&erasureNumber);
    kj::_::BTreeImpl::Iterator::operator++((Iterator *)&__end0.row);
  }
  __end2 = Vector<unsigned_long>::begin((Vector<unsigned_long> *)local_38);
  puVar4 = Vector<unsigned_long>::end((Vector<unsigned_long> *)local_38);
  for (; __end2 != puVar4; __end2 = __end2 + 1) {
    Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
    ::eraseImpl((Table<kj::TreeMap<kj::String,_int>::Entry,_kj::TreeIndex<kj::TreeMap<kj::String,_int>::Callbacks>_>
                 *)this,*__end2);
  }
  sVar5 = Vector<unsigned_long>::size((Vector<unsigned_long> *)local_38);
  Vector<unsigned_long>::~Vector((Vector<unsigned_long> *)local_38);
  return sVar5;
}

Assistant:

size_t Table<Row, Indexes...>::eraseAllImpl(Collection&& collection) {
  // We need to transform the collection of row numbers into a sequence of erasures, accounting
  // for the fact that each erasure re-positions the last row into its slot.
  Vector<size_t> erased;
  _::tryReserveSize(erased, collection);
  for (size_t pos: collection) {
    while (pos >= rows.size() - erased.size()) {
      // Oops, the next item to be erased is already scheduled to be moved to a different location
      // due to a previous erasure. Figure out where it will be at this point.
      size_t erasureNumber = rows.size() - pos - 1;
      pos = erased[erasureNumber];
    }
    erased.add(pos);
  }

  // Now we can execute the sequence of erasures.
  for (size_t pos: erased) {
    eraseImpl(pos);
  }

  return erased.size();
}